

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O1

int get_request(curl_socket_t sock,httprequest *req)

{
  byte bVar1;
  unsigned_short uVar2;
  int iVar3;
  ulong uVar4;
  ssize_t sVar5;
  uint *puVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  int *piVar14;
  char *pcVar15;
  uint uVar16;
  byte *__nptr;
  byte *pbVar17;
  bool bVar18;
  int prot_minor;
  int prot_major;
  char *ptr;
  char *endp;
  char logbuf [456];
  uint local_220;
  uint local_21c;
  char *local_218;
  char *local_210;
  ulong local_208;
  byte *local_200;
  char local_1f8 [456];
  
  uVar4 = req->offset;
  if (uVar4 < 149999) {
    if (req->skip == 0) {
      sVar10 = 149999 - uVar4;
    }
    else {
      sVar10 = req->cl;
    }
    sVar5 = recv(sock,req->reqbuf + uVar4,sVar10,0);
    if (got_exit_signal != 0) {
      return -1;
    }
    if (sVar5 == 0) {
      logmsg("Connection closed by client");
      bVar18 = true;
    }
    else {
      bVar18 = false;
      if (sVar5 < 0) {
        puVar6 = (uint *)__errno_location();
        uVar16 = *puVar6;
        bVar18 = uVar16 != 0xb;
        if (!bVar18) {
          return 0;
        }
        pcVar7 = strerror(uVar16);
        logmsg("recv() returned error: (%d) %s",(ulong)uVar16,pcVar7);
      }
    }
    if (bVar18) {
      req->reqbuf[req->offset] = '\0';
      storerequest(req->reqbuf,req->offset);
      return -1;
    }
    logmsg("Read %zd bytes",sVar5);
    sVar8 = req->offset + sVar5;
    req->offset = sVar8;
    req->reqbuf[sVar8] = '\0';
    pcVar7 = req->reqbuf + req->checkindex;
    pcVar9 = strstr(pcVar7,end_of_headers);
    iVar3 = req->callcount;
    req->callcount = iVar3 + 1;
    pcVar15 = "";
    if (0 < iVar3) {
      pcVar15 = " [CONTINUED]";
    }
    logmsg("Process %d bytes request%s",req->offset,pcVar15);
    if (((use_gopher == '\x01') && (req->testno == -4)) &&
       (iVar3 = strncmp("/verifiedserver",pcVar7,0xf), iVar3 == 0)) {
      logmsg("Are-we-friendly question received");
      req->testno = -2;
LAB_0010705b:
      uVar16 = 1;
    }
    else {
      if ((req->testno == -4) &&
         (iVar3 = __isoc99_sscanf(pcVar7,"%255s %139999s HTTP/%d.%d",ProcessRequest_request,
                                  &ProcessRequest_doc,&local_21c,&local_220), uVar16 = local_220,
         iVar3 == 4)) {
        local_208 = (ulong)local_21c;
        req->prot_version = local_220 + local_21c * 10;
        pcVar15 = strrchr(&ProcessRequest_doc,0x2f);
        local_218 = pcVar15;
        if (pcVar15 != (char *)0x0) {
          local_210 = pcVar9;
          sVar10 = strlen(&ProcessRequest_doc);
          sVar11 = strlen(ProcessRequest_request);
          if (sVar11 + sVar10 < 400) {
            curl_msnprintf(local_1f8,0x1c8,"Got request: %s %s HTTP/%d.%d",ProcessRequest_request,
                           &ProcessRequest_doc,local_208,uVar16);
          }
          else {
            curl_msnprintf(local_1f8,0x1c8,"Got a *HUGE* request HTTP/%d.%d",local_208,(ulong)uVar16
                          );
          }
          logmsg("%s",local_1f8);
          iVar3 = strncmp("/verifiedserver",pcVar15,0xf);
          pcVar9 = local_210;
          if (iVar3 == 0) {
            lVar13 = -2;
            pcVar7 = "Are-we-friendly question received";
          }
          else {
            iVar3 = strncmp("/quit",pcVar15,5);
            if (iVar3 != 0) {
              do {
                pcVar15 = pcVar15 + 1;
                if (*pcVar15 == 0) break;
                iVar3 = Curl_isdigit((uint)(byte)*pcVar15);
              } while (iVar3 == 0);
              local_218 = pcVar15;
              uVar12 = strtol(pcVar15,&local_218,10);
              req->testno = uVar12;
              if ((long)uVar12 < 0x2711) {
                req->partno = 0;
              }
              else {
                req->partno = uVar12 % 10000;
                req->testno = uVar12 / 10000;
              }
              if (req->testno == 0) {
                logmsg("No test number");
                req->testno = -4;
              }
              else {
                curl_msnprintf(local_1f8,0x1c8,"Requested test number %ld part %ld",req->testno,
                               req->partno);
                logmsg("%s",local_1f8);
              }
              goto LAB_0010698a;
            }
            lVar13 = -3;
            pcVar7 = "Request-to-quit received";
          }
          logmsg(pcVar7);
          req->testno = lVar13;
          uVar16 = 1;
          goto LAB_00107061;
        }
LAB_0010698a:
        if ((req->testno == -4) &&
           (iVar3 = __isoc99_sscanf(req,"CONNECT %139999s HTTP/%d.%d",&ProcessRequest_doc,&local_21c
                                    ,&local_220), iVar3 == 3)) {
          curl_msnprintf(local_1f8,0x1c8,"Received a CONNECT %s HTTP/%d.%d request",
                         &ProcessRequest_doc,(ulong)local_21c,(ulong)local_220);
          logmsg("%s");
          req->connect_request = true;
          if (req->prot_version == 10) {
            req->open = false;
          }
          if (ProcessRequest_doc == '[') {
            uVar12 = 0;
            pbVar17 = &DAT_0010e781;
            local_210 = pcVar9;
            if (DAT_0010e781 != 0) {
              __nptr = &DAT_0010e781;
              bVar1 = DAT_0010e781;
              do {
                iVar3 = Curl_isxdigit((uint)bVar1);
                if (((iVar3 == 0) && (*__nptr != 0x3a)) && (pbVar17 = __nptr, *__nptr != 0x2e))
                break;
                uVar12 = strtoul((char *)__nptr,(char **)&local_200,0x10);
                iVar3 = Curl_isxdigit((uint)*__nptr);
                pbVar17 = local_200;
                if (iVar3 == 0) {
                  pbVar17 = __nptr + 1;
                }
                bVar1 = *pbVar17;
                __nptr = pbVar17;
              } while (bVar1 != 0);
            }
            if (*pbVar17 == 0x5d) {
              if (pbVar17[1] != 0x3a) {
                pcVar9 = "Invalid CONNECT IPv6 port format";
                goto LAB_00106ac4;
              }
              pbVar17 = pbVar17 + 1;
            }
            else {
              pcVar9 = "Invalid CONNECT IPv6 address format";
LAB_00106ac4:
              pbVar17 = (byte *)0x0;
              logmsg(pcVar9);
            }
            req->testno = uVar12;
            pcVar9 = local_210;
          }
          else {
            pbVar17 = (byte *)strchr(&ProcessRequest_doc,0x3a);
          }
          if (((pbVar17 != (byte *)0x0) && (pbVar17[1] != 0)) &&
             (iVar3 = Curl_isdigit((uint)pbVar17[1]), iVar3 != 0)) {
            uVar12 = strtoul((char *)(pbVar17 + 1),(char **)0x0,10);
            if (uVar12 - 0x10000 < 0xffffffffffff0001) {
              logmsg("Invalid CONNECT port received");
            }
            else {
              uVar2 = curlx_ultous(uVar12);
              req->connect_port = uVar2;
            }
          }
          logmsg("Port number: %d, test case number: %ld",(ulong)req->connect_port,req->testno);
        }
        if (req->testno == -4) {
          local_218 = strrchr(&ProcessRequest_doc,0x2e);
          if (local_218 != (char *)0x0) {
            local_218 = local_218 + 1;
            uVar12 = strtol(local_218,&local_218,10);
            req->testno = uVar12;
            if ((long)uVar12 < 0x2711) {
              req->partno = 0;
            }
            else {
              req->partno = uVar12 % 10000;
              req->testno = uVar12 / 10000;
              logmsg("found test %d in requested host name",uVar12 / 10000);
            }
            curl_msnprintf(local_1f8,0x1c8,"Requested test number %ld part %ld (from host name)",
                           req->testno,req->partno);
            logmsg("%s",local_1f8);
          }
          if (req->testno == 0) {
            logmsg("Did not find test number in PATH");
            req->testno = -1;
          }
          else {
            parse_servercmd(req);
          }
        }
      }
      else if ((2 < req->offset) && (req->testno == -4)) {
        logmsg("** Unusual request. Starts with %02x %02x %02x (%c%c%c)");
      }
      if (pcVar9 != (char *)0x0) {
        logmsg("- request found to be complete (%d)",req->testno);
        if (req->testno == -4) {
          pcVar15 = strstr(pcVar7,"\nTestno: ");
          if (pcVar15 == (char *)0x0) {
            logmsg("No Testno: header");
          }
          else {
            lVar13 = strtol(pcVar15 + 9,(char **)0x0,10);
            req->testno = lVar13;
            logmsg("Found test number %d in Testno: header!",lVar13);
          }
        }
        parse_servercmd(req);
        if ((use_gopher == '\x01') &&
           (pcVar15 = strrchr(pcVar7,0x2f), local_218 = pcVar15, pcVar15 != (char *)0x0)) {
          do {
            pcVar15 = pcVar15 + 1;
            if (*pcVar15 == 0) break;
            iVar3 = Curl_isdigit((uint)(byte)*pcVar15);
          } while (iVar3 == 0);
          local_218 = pcVar15;
          uVar12 = strtol(pcVar15,&local_218,10);
          req->testno = uVar12;
          if ((long)uVar12 < 0x2711) {
            req->partno = 0;
          }
          else {
            req->partno = uVar12 % 10000;
            req->testno = uVar12 / 10000;
          }
          curl_msnprintf(local_1f8,0x1c8,"Requested GOPHER test number %ld part %ld",req->testno,
                         req->partno);
          logmsg("%s",local_1f8);
        }
        bVar18 = false;
        local_210 = pcVar9;
LAB_00106ddd:
        if (got_exit_signal != 0) goto LAB_0010705b;
        if ((req->cl != 0) ||
           (iVar3 = Curl_strncasecompare("Content-Length:",pcVar7,0xf), iVar3 == 0)) {
          iVar3 = Curl_strncasecompare("Transfer-Encoding: chunked",pcVar7,0x1a);
          if (iVar3 != 0) {
            bVar18 = true;
          }
          if (!bVar18) goto code_r0x00106e34;
          pcVar7 = strstr(req->reqbuf,"\r\n0\r\n\r\n");
          if (pcVar7 != (char *)0x0) goto LAB_0010705b;
          pcVar7 = strstr(req->reqbuf,"\r\n0\r\n");
          if (pcVar7 == (char *)0x0) {
            uVar16 = 1;
            if ((already_recv_zeroed_chunk != '\x01') ||
               (pcVar7 = strstr(req->reqbuf,"\r\n\r\n"), pcVar7 == (char *)0x0)) goto LAB_00107108;
          }
          else {
            pcVar9 = strstr(req->reqbuf,"\r\n\r\n");
            do {
              pcVar15 = pcVar9;
              pcVar9 = strstr(pcVar15 + 4,"\r\n\r\n");
            } while (pcVar9 != (char *)0x0);
            uVar16 = 1;
            if (pcVar15 <= pcVar7) {
              already_recv_zeroed_chunk = '\x01';
LAB_00107108:
              uVar16 = 0;
            }
          }
          goto LAB_00107061;
        }
        bVar1 = pcVar7[0xf];
        pcVar7 = pcVar7 + 0xf;
        while ((bVar1 != 0 && (iVar3 = Curl_isspace((uint)bVar1), iVar3 != 0))) {
          bVar1 = pcVar7[1];
          pcVar7 = pcVar7 + 1;
        }
        local_218 = pcVar7;
        piVar14 = __errno_location();
        *piVar14 = 0;
        uVar12 = strtoul(pcVar7,&local_218,10);
        if (((pcVar7 == local_218) || (iVar3 = Curl_isspace((uint)(byte)*local_218), iVar3 == 0)) ||
           (*piVar14 == 0x22)) {
          logmsg("Found invalid Content-Length: (%s) in the request",pcVar7);
          req->open = false;
          goto LAB_0010705b;
        }
        req->cl = uVar12 - (long)req->skip;
        logmsg("Found Content-Length: %lu in the request",uVar12);
        if (req->skip != 0) {
          logmsg("... but will abort after %zu bytes",req->cl);
        }
LAB_00106e4e:
        if (((req->auth == false) &&
            (pcVar7 = strstr(req->reqbuf,"Authorization:"), pcVar7 != (char *)0x0)) &&
           (req->auth = true, req->auth_req == true)) {
          logmsg("Authorization header found, as required");
        }
        pcVar9 = strstr(req->reqbuf,"Authorization: Negotiate");
        pcVar7 = local_210;
        if (pcVar9 == (char *)0x0) {
          if ((req->digest == false) &&
             (pcVar9 = strstr(req->reqbuf,"Authorization: Digest"), pcVar9 != (char *)0x0)) {
            sVar8 = req->partno + 1000;
            req->partno = sVar8;
            req->digest = true;
            pcVar9 = "Received Digest request, sending back data %ld";
          }
          else if (req->ntlm == false) {
            pcVar9 = strstr(req->reqbuf,"Authorization: NTLM TlRMTVNTUAAD");
            if (pcVar9 == (char *)0x0) {
              pcVar9 = strstr(req->reqbuf,"Authorization: NTLM TlRMTVNTUAAB");
              if (pcVar9 == (char *)0x0) goto LAB_00107097;
              sVar8 = req->partno + 0x3e9;
              req->partno = sVar8;
              req->ntlm = true;
              pcVar9 = "Received NTLM type-1, sending back data %ld";
            }
            else {
              req->partno = req->partno + 0x3ea;
              req->ntlm = true;
              logmsg("Received NTLM type-3, sending back data %ld");
              sVar8 = req->cl;
              if (sVar8 == 0) goto LAB_001071f8;
              pcVar9 = "  Expecting %zu POSTed bytes";
            }
          }
          else {
LAB_00107097:
            lVar13 = req->partno;
            if ((lVar13 < 1000) ||
               (pcVar9 = strstr(req->reqbuf,"Authorization: Basic"), pcVar9 == (char *)0x0))
            goto LAB_001071f8;
            sVar8 = lVar13 + 1;
            req->partno = sVar8;
            pcVar9 = "Received Basic request, sending back data %ld";
          }
          logmsg(pcVar9,sVar8);
        }
        else {
          logmsg("Negotiate: prev_testno: %d, prev_partno: %d",ProcessRequest_prev_testno,
                 ProcessRequest_prev_partno);
          if (req->testno != ProcessRequest_prev_testno) {
            ProcessRequest_prev_partno = req->partno;
            ProcessRequest_prev_testno = req->testno;
          }
          ProcessRequest_prev_partno = ProcessRequest_prev_partno + 1;
          req->partno = ProcessRequest_prev_partno;
        }
LAB_001071f8:
        pcVar9 = strstr(req->reqbuf,"Connection: close");
        if (pcVar9 != (char *)0x0) {
          req->open = false;
        }
        if (((((req->open == true) && (10 < req->prot_version)) &&
             (sVar8 = req->offset, sVar10 = strlen(end_of_headers),
             pcVar7 + sVar10 < req->reqbuf + sVar8)) && (req->cl == 0)) &&
           ((iVar3 = strncmp(req->reqbuf,"GET",3), iVar3 == 0 ||
            (iVar3 = strncmp(req->reqbuf,"HEAD",4), iVar3 == 0)))) {
          req->checkindex = (size_t)(pcVar7 + (sVar10 - (long)req));
        }
        uVar16 = 1;
        if ((req->auth_req != true) || (req->auth != false)) {
          if ((req->upgrade == true) &&
             (pcVar9 = strstr(req->reqbuf,"Upgrade:"), pcVar9 != (char *)0x0)) {
            logmsg("Found Upgrade: in request and allows it");
            req->upgrade_request = true;
          }
          uVar12 = req->cl;
          if (uVar12 != 0) {
            sVar8 = req->offset;
            sVar10 = strlen(end_of_headers);
            uVar16 = (uint)(uVar12 <= (long)req + (sVar8 - (long)(pcVar7 + sVar10)));
          }
          goto LAB_00107061;
        }
        pcVar7 = "Return early due to auth requested by none provided";
        uVar16 = 1;
        goto LAB_00106cc7;
      }
      pcVar7 = "request not complete yet";
      uVar16 = 0;
LAB_00106cc7:
      logmsg(pcVar7);
    }
LAB_00107061:
    req->done_processing = uVar16;
    if (got_exit_signal != 0) {
      return -1;
    }
  }
  else {
    sVar5 = 0;
  }
  pcVar7 = "Request would overflow buffer, closing connection";
  if ((uVar4 < 149999) && ((uVar4 = req->offset, uVar4 != 149999 || (sVar5 < 1)))) {
    bVar18 = true;
    if (uVar4 < 150000) goto LAB_0010652c;
    pcVar7 = "Request buffer overflow, closing connection";
  }
  bVar18 = false;
  logmsg(pcVar7);
  uVar4 = 149999;
LAB_0010652c:
  req->reqbuf[uVar4] = '\0';
  if ((!bVar18) || (req->done_processing != 0)) {
    storerequest(req->reqbuf,req->offset);
  }
  return -(uint)(byte)(~bVar18 | got_exit_signal != 0) | 1;
code_r0x00106e34:
  pcVar9 = strchr(pcVar7,10);
  pcVar7 = pcVar9 + 1;
  if (pcVar9 == (char *)0x0) goto LAB_00106e4e;
  goto LAB_00106ddd;
}

Assistant:

static int get_request(curl_socket_t sock, struct httprequest *req)
{
  int fail = 0;
  char *reqbuf = req->reqbuf;
  ssize_t got = 0;
  int overflow = 0;

  if(req->offset >= REQBUFSIZ-1) {
    /* buffer is already full; do nothing */
    overflow = 1;
  }
  else {
    if(req->skip)
      /* we are instructed to not read the entire thing, so we make sure to
         only read what we're supposed to and NOT read the enire thing the
         client wants to send! */
      got = sread(sock, reqbuf + req->offset, req->cl);
    else
      got = sread(sock, reqbuf + req->offset, REQBUFSIZ-1 - req->offset);

    if(got_exit_signal)
      return -1;
    if(got == 0) {
      logmsg("Connection closed by client");
      fail = 1;
    }
    else if(got < 0) {
      int error = SOCKERRNO;
      if(EAGAIN == error || EWOULDBLOCK == error) {
        /* nothing to read at the moment */
        return 0;
      }
      logmsg("recv() returned error: (%d) %s", error, strerror(error));
      fail = 1;
    }
    if(fail) {
      /* dump the request received so far to the external file */
      reqbuf[req->offset] = '\0';
      storerequest(reqbuf, req->offset);
      return -1;
    }

    logmsg("Read %zd bytes", got);

    req->offset += (size_t)got;
    reqbuf[req->offset] = '\0';

    req->done_processing = ProcessRequest(req);
    if(got_exit_signal)
      return -1;
  }

  if(overflow || (req->offset == REQBUFSIZ-1 && got > 0)) {
    logmsg("Request would overflow buffer, closing connection");
    /* dump request received so far to external file anyway */
    reqbuf[REQBUFSIZ-1] = '\0';
    fail = 1;
  }
  else if(req->offset > REQBUFSIZ-1) {
    logmsg("Request buffer overflow, closing connection");
    /* dump request received so far to external file anyway */
    reqbuf[REQBUFSIZ-1] = '\0';
    fail = 1;
  }
  else
    reqbuf[req->offset] = '\0';

  /* at the end of a request dump it to an external file */
  if(fail || req->done_processing)
    storerequest(reqbuf, req->offset);
  if(got_exit_signal)
    return -1;

  return fail ? -1 : 1;
}